

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall DLevelScript::Link(DLevelScript *this)

{
  DLevelScript *pointed;
  DObject *pointing;
  TObjPtr<DACSThinker> pointing_00;
  
  if ((DACSThinker::ActiveThinker.field_0 != (DACSThinker *)0x0) &&
     ((*(byte *)((long)DACSThinker::ActiveThinker.field_0 + 0x20) & 0x20) != 0)) {
    DACSThinker::ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1)0x0;
  }
  pointing_00.field_0 = DACSThinker::ActiveThinker.field_0;
  pointed = *(DLevelScript **)((long)DACSThinker::ActiveThinker.field_0 + 0x58);
  this->next = pointed;
  if (((pointed != (DLevelScript *)0x0) && (((pointed->super_DObject).ObjectFlags & 3) != 0)) &&
     (((this->super_DObject).ObjectFlags & 4) != 0)) {
    GC::Barrier(&this->super_DObject,&pointed->super_DObject);
  }
  pointing = *(DObject **)((long)pointing_00.field_0 + 0x58);
  if (((pointing != (DObject *)0x0) &&
      (pointing[1].Class = (PClass *)this, ((this->super_DObject).ObjectFlags & 3) != 0)) &&
     ((pointing->ObjectFlags & 4) != 0)) {
    GC::Barrier(pointing,&this->super_DObject);
  }
  this->prev = (DLevelScript *)0x0;
  *(DLevelScript **)((long)pointing_00.field_0 + 0x58) = this;
  if ((((this->super_DObject).ObjectFlags & 3) != 0) &&
     ((*(byte *)((long)pointing_00.field_0 + 0x20) & 4) != 0)) {
    GC::Barrier((DObject *)pointing_00.field_0,&this->super_DObject);
  }
  if (*(long *)((long)pointing_00.field_0 + 0x50) == 0) {
    *(DLevelScript **)((long)pointing_00.field_0 + 0x50) = this;
  }
  return;
}

Assistant:

void DLevelScript::Link ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	next = controller->Scripts;
	GC::WriteBarrier(this, next);
	if (controller->Scripts)
	{
		controller->Scripts->prev = this;
		GC::WriteBarrier(controller->Scripts, this);
	}
	prev = NULL;
	controller->Scripts = this;
	GC::WriteBarrier(controller, this);
	if (controller->LastScript == NULL)
	{
		controller->LastScript = this;
	}
}